

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sampleIsBetter(Stat4Accum *pAccum,Stat4Sample *pNew,Stat4Sample *pOld)

{
  int iVar1;
  bool local_31;
  tRowcnt nEqOld;
  tRowcnt nEqNew;
  Stat4Sample *pOld_local;
  Stat4Sample *pNew_local;
  Stat4Accum *pAccum_local;
  
  if (pOld->anEq[pOld->iCol] < pNew->anEq[pNew->iCol]) {
    pAccum_local._4_4_ = 1;
  }
  else if (pNew->anEq[pNew->iCol] == pOld->anEq[pOld->iCol]) {
    if (pNew->iCol < pOld->iCol) {
      pAccum_local._4_4_ = 1;
    }
    else {
      local_31 = false;
      if (pNew->iCol == pOld->iCol) {
        iVar1 = sampleIsBetterPost(pAccum,pNew,pOld);
        local_31 = iVar1 != 0;
      }
      pAccum_local._4_4_ = (uint)local_31;
    }
  }
  else {
    pAccum_local._4_4_ = 0;
  }
  return pAccum_local._4_4_;
}

Assistant:

static int sampleIsBetter(
  Stat4Accum *pAccum, 
  Stat4Sample *pNew, 
  Stat4Sample *pOld
){
  tRowcnt nEqNew = pNew->anEq[pNew->iCol];
  tRowcnt nEqOld = pOld->anEq[pOld->iCol];

  assert( pOld->isPSample==0 && pNew->isPSample==0 );
  assert( IsStat4 || (pNew->iCol==0 && pOld->iCol==0) );

  if( (nEqNew>nEqOld) ) return 1;
#ifdef SQLITE_ENABLE_STAT4
  if( nEqNew==nEqOld ){
    if( pNew->iCol<pOld->iCol ) return 1;
    return (pNew->iCol==pOld->iCol && sampleIsBetterPost(pAccum, pNew, pOld));
  }
  return 0;
#else
  return (nEqNew==nEqOld && pNew->iHash>pOld->iHash);
#endif
}